

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_randomnumberutil.cpp
# Opt level: O0

void __thiscall
RandomNumberUtil_GetRandomBool_Test::TestBody(RandomNumberUtil_GetRandomBool_Test *this)

{
  bool bVar1;
  AssertHelper local_58;
  Message local_50 [3];
  undefined1 local_38 [8];
  vector<bool,_std::allocator<bool>_> cashe;
  RandomNumberUtil_GetRandomBool_Test *this_local;
  
  cashe.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)this;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_38);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::RandomNumberUtil::GetRandomBool((vector<bool,_std::allocator<bool>_> *)local_38);
    }
  }
  else {
    testing::Message::Message(local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x59,
               "Expected: RandomNumberUtil::GetRandomBool(&cashe) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(local_50);
  }
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_38)
  ;
  return;
}

Assistant:

TEST(RandomNumberUtil, GetRandomBool) {
  std::vector<bool> cashe;
  EXPECT_NO_THROW(RandomNumberUtil::GetRandomBool(&cashe));
}